

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O3

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::operator()(BidiagonalMatrix *this,int i,int j)

{
  uint uVar1;
  
  if (0x3b < (uint)i) {
    __assert_fail("i >= 0 && i < M",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                  ,0xf8,
                  "double singular::Svd<60, 50>::BidiagonalMatrix::operator()(int, int) const [M = 60, N = 50]"
                 );
  }
  if ((uint)j < 0x32) {
    if (i == j) {
      uVar1 = i * 2;
    }
    else {
      if (i + 1 != j) {
        return 0.0;
      }
      uVar1 = i * 2 + 1;
    }
    return this->pBlock[uVar1];
  }
  __assert_fail("j >= 0 && j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                ,0xf9,
                "double singular::Svd<60, 50>::BidiagonalMatrix::operator()(int, int) const [M = 60, N = 50]"
               );
}

Assistant:

double operator ()(int i, int j) const {
				assert(i >= 0 && i < M);
				assert(j >= 0 && j < N);
				if (i == j) {
					return this->pBlock[2 * i];
				} else if (i + 1 == j) {
					return this->pBlock[2 * i + 1];
				} else {
					return 0.0;
				}
			}